

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_HexString<double>_>,_HexString<double>_>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  char16_t cVar1;
  long lVar2;
  QChar *pQVar3;
  long lVar4;
  char16_t *__src;
  long in_FS_OFFSET;
  char16_t local_48 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (p->a).a.a.m_size;
  QAbstractConcatenable::appendLatin1To((p->a).a.a,*out);
  pQVar3 = *out;
  *out = pQVar3 + lVar4;
  lVar2 = (p->a).a.b.d.size;
  if (lVar2 != 0) {
    __src = (p->a).a.b.d.ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(pQVar3 + lVar4,__src,lVar2 * 2);
  }
  pQVar3 = *out;
  *out = pQVar3 + lVar2;
  builtin_memcpy(local_48,L"0123456789abcdef",0x20);
  pQVar3 = pQVar3 + lVar2 + 1;
  lVar4 = 0;
  do {
    cVar1 = local_48[*(byte *)((long)&(p->a).b.val + lVar4) & 0xf];
    *out = pQVar3;
    pQVar3[-1].ucs = cVar1;
    cVar1 = local_48[*(byte *)((long)&(p->a).b.val + lVar4) >> 4];
    *out = pQVar3 + 1;
    pQVar3->ucs = cVar1;
    pQVar3 = pQVar3 + 2;
    lVar4 = lVar4 + 1;
  } while ((int)lVar4 != 8);
  builtin_memcpy(local_48,L"0123456789abcdef",0x20);
  lVar4 = 0;
  do {
    cVar1 = local_48[*(byte *)((long)&(p->b).val + lVar4) & 0xf];
    *out = pQVar3;
    pQVar3[-1].ucs = cVar1;
    cVar1 = local_48[*(byte *)((long)&(p->b).val + lVar4) >> 4];
    *out = pQVar3 + 1;
    pQVar3->ucs = cVar1;
    lVar4 = lVar4 + 1;
    pQVar3 = pQVar3 + 2;
  } while ((int)lVar4 != 8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }